

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O1

bool __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::UpdateInstances
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,TLASBuildInstanceData *pInstances,
          Uint32 InstanceCount,Uint32 BaseContributionToHitGroupIndex,Uint32 HitGroupStride,
          HIT_GROUP_BINDING_MODE BindingMode)

{
  _Hash_node_base *AutoPtr;
  InstanceDesc *Desc;
  BottomLevelASVkImpl *pObj;
  Uint32 UVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  long lVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  byte bVar6;
  undefined4 in_register_00000084;
  char (*Args_2) [39];
  _Hash_node_base *p_Var7;
  TLASBuildInstanceData *Inst;
  ulong uVar8;
  bool bVar10;
  Uint32 InstanceOffset;
  string msg;
  Uint32 local_90;
  Uint32 local_8c;
  undefined1 local_88 [32];
  char (*local_68) [39];
  TopLevelASBase<Diligent::EngineVkImplTraits> *local_60;
  ulong local_58;
  uint local_50;
  Uint32 local_4c;
  long local_48;
  ulong local_40;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  undefined7 uVar9;
  
  Args_2 = (char (*) [39])CONCAT44(in_register_00000084,HitGroupStride);
  local_8c = BaseContributionToHitGroupIndex;
  local_68 = Args_2;
  local_60 = this;
  if ((this->m_BuildInfo).InstanceCount != InstanceCount) {
    FormatString<char[26],char[49]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_BuildInfo.InstanceCount == InstanceCount",
               (char (*) [49])CONCAT44(in_register_0000000c,BaseContributionToHitGroupIndex));
    DebugAssertionFailed
              ((Char *)local_88._0_8_,"UpdateInstances",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xac);
    if ((BottomLevelASVkImpl *)local_88._0_8_ != (BottomLevelASVkImpl *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  local_90 = local_8c;
  bVar10 = InstanceCount == 0;
  if (bVar10) {
    bVar6 = 0;
  }
  else {
    local_38 = &(local_60->m_Instances)._M_h;
    local_40 = (ulong)InstanceCount;
    local_48 = -local_40;
    uVar5 = 1;
    local_58 = 0;
    local_50 = (uint)BindingMode;
    do {
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)local_88,pInstances->InstanceName,false);
      p_Var3 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_38,(local_88._8_8_ & 0x7fffffffffffffff) %
                                   (local_60->m_Instances)._M_h._M_bucket_count,(key_type *)local_88
                          ,local_88._8_8_ & 0x7fffffffffffffff);
      if (p_Var3 == (__node_base_ptr)0x0) {
        p_Var7 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var7 = p_Var3->_M_nxt;
      }
      if (((BottomLevelASVkImpl *)local_88._0_8_ != (BottomLevelASVkImpl *)0x0) &&
         ((long)local_88._8_8_ < 0)) {
        operator_delete__((void *)local_88._0_8_);
      }
      if (p_Var7 == (_Hash_node_base *)0x0) {
        FormatString<char[36],char_const*,char[39]>
                  ((string *)local_88,(Diligent *)"Failed to find instance with name \'",
                   (char (*) [36])pInstances,(char **)"\' in instances from the previous build",
                   Args_2);
        DebugAssertionFailed
                  ((Char *)local_88._0_8_,"UpdateInstances",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
                   ,0xb9);
        if ((BottomLevelASVkImpl *)local_88._0_8_ != (BottomLevelASVkImpl *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
      }
      else {
        local_4c = *(Uint32 *)&p_Var7[3]._M_nxt;
        AutoPtr = p_Var7 + 4;
        RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)local_88,
                   (RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)AutoPtr);
        pObj = (BottomLevelASVkImpl *)pInstances->pBLAS;
        if (pObj != (BottomLevelASVkImpl *)0x0) {
          CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
                    ((IBottomLevelAS *)pObj);
        }
        Desc = (InstanceDesc *)(p_Var7 + 3);
        RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator=
                  ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)AutoPtr,pObj);
        Desc->ContributionToHitGroupIndex = pInstances->ContributionToHitGroupIndex;
        CalculateHitGroupIndex(Desc,&local_90,(Uint32)local_68,(HIT_GROUP_BINDING_MODE)local_50);
        uVar9 = (undefined7)((ulong)pObj >> 8);
        uVar8 = CONCAT71(uVar9,1);
        if (((local_58 & 1) == 0) &&
           ((BottomLevelASVkImpl *)local_88._0_8_ == (BottomLevelASVkImpl *)AutoPtr->_M_nxt)) {
          uVar8 = CONCAT71(uVar9,local_4c != Desc->ContributionToHitGroupIndex);
        }
        *(undefined4 *)&p_Var7[5]._M_nxt = *(undefined4 *)&p_Var7[4]._M_nxt[0x18]._M_nxt;
        RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release
                  ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)local_88);
        local_58 = uVar8 & 0xffffffff;
      }
      if (p_Var7 == (_Hash_node_base *)0x0) break;
      bVar10 = local_40 <= uVar5;
      pInstances = pInstances + 1;
      lVar4 = local_48 + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar4 != 0);
    bVar6 = (byte)local_58;
  }
  if (bVar10 != false) {
    UVar1 = (Uint32)local_68;
    iVar2 = -1;
    if (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS) {
      iVar2 = UVar1 - 1;
    }
    if (((((bVar6 & 1) != 0 || (local_60->m_BuildInfo).HitGroupStride != UVar1) ||
         ((local_60->m_BuildInfo).FirstContributionToHitGroupIndex != local_8c)) ||
        ((local_60->m_BuildInfo).LastContributionToHitGroupIndex != iVar2 + local_90)) ||
       ((local_60->m_BuildInfo).BindingMode != BindingMode)) {
      LOCK();
      (local_60->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
           (local_60->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    (local_60->m_BuildInfo).HitGroupStride = UVar1;
    (local_60->m_BuildInfo).FirstContributionToHitGroupIndex = local_8c;
    (local_60->m_BuildInfo).LastContributionToHitGroupIndex = iVar2 + local_90;
    (local_60->m_BuildInfo).BindingMode = BindingMode;
  }
  return bVar10;
}

Assistant:

bool UpdateInstances(const TLASBuildInstanceData* pInstances,
                         const Uint32                 InstanceCount,
                         const Uint32                 BaseContributionToHitGroupIndex,
                         const Uint32                 HitGroupStride,
                         const HIT_GROUP_BINDING_MODE BindingMode) noexcept
    {
        VERIFY_EXPR(this->m_BuildInfo.InstanceCount == InstanceCount);
#ifdef DILIGENT_DEVELOPMENT
        bool Changed = false;
#endif
        Uint32 InstanceOffset = BaseContributionToHitGroupIndex;

        for (Uint32 i = 0; i < InstanceCount; ++i)
        {
            const auto& Inst = pInstances[i];
            auto        Iter = this->m_Instances.find(Inst.InstanceName);

            if (Iter == this->m_Instances.end())
            {
                UNEXPECTED("Failed to find instance with name '", Inst.InstanceName, "' in instances from the previous build");
                return false;
            }

            auto&      Desc      = Iter->second;
            const auto PrevIndex = Desc.ContributionToHitGroupIndex;
            const auto pPrevBLAS = Desc.pBLAS;

            Desc.pBLAS                       = ClassPtrCast<BottomLevelASImplType>(Inst.pBLAS);
            Desc.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            //Desc.InstanceIndex             = i; // keep Desc.InstanceIndex unmodified
            CalculateHitGroupIndex(Desc, InstanceOffset, HitGroupStride, BindingMode);

#ifdef DILIGENT_DEVELOPMENT
            Changed         = Changed || (pPrevBLAS != Desc.pBLAS);
            Changed         = Changed || (PrevIndex != Desc.ContributionToHitGroupIndex);
            Desc.dvpVersion = Desc.pBLAS->DvpGetVersion();
#endif
        }

        InstanceOffset = InstanceOffset + (BindingMode == HIT_GROUP_BINDING_MODE_PER_TLAS ? HitGroupStride : 0) - 1;

#ifdef DILIGENT_DEVELOPMENT
        Changed = Changed || (this->m_BuildInfo.HitGroupStride != HitGroupStride);
        Changed = Changed || (this->m_BuildInfo.FirstContributionToHitGroupIndex != BaseContributionToHitGroupIndex);
        Changed = Changed || (this->m_BuildInfo.LastContributionToHitGroupIndex != InstanceOffset);
        Changed = Changed || (this->m_BuildInfo.BindingMode != BindingMode);
        if (Changed)
            this->m_DvpVersion.fetch_add(1);
#endif
        this->m_BuildInfo.HitGroupStride                   = HitGroupStride;
        this->m_BuildInfo.FirstContributionToHitGroupIndex = BaseContributionToHitGroupIndex;
        this->m_BuildInfo.LastContributionToHitGroupIndex  = InstanceOffset;
        this->m_BuildInfo.BindingMode                      = BindingMode;

        return true;
    }